

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O0

string * gmlc::utilities::stringOps::removeChar_abi_cxx11_(string_view source,char remchar)

{
  const_iterator __value;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string_view<char,_std::char_traits<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  __result.container = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffffa0);
  std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (in_RDI,in_stack_ffffffffffffffa8);
  this = &local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::begin(this);
  __value = std::basic_string_view<char,_std::char_traits<char>_>::end(this);
  __last = std::back_inserter<std::__cxx11::string>(in_stack_ffffffffffffff88);
  std::remove_copy<char_const*,std::back_insert_iterator<std::__cxx11::string>,char>
            ((char *)in_RDI,(char *)__last.container,__result,__value);
  return (string *)in_RDI;
}

Assistant:

std::string removeChar(std::string_view source, char remchar)
    {
        std::string result;
        result.reserve(source.length());
        std::remove_copy(
            source.begin(), source.end(), std::back_inserter(result), remchar);
        return result;
    }